

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

adiak_datatype_t *
parse_typestr_helper
          (char *typestr,int typestr_start,int typestr_end,int is_reference,va_list *ap,
          int *new_typestr_start)

{
  uint uVar1;
  bool bVar2;
  char endchar;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  adiak_datatype_t **ppaVar6;
  adiak_datatype_t *paVar7;
  adiak_type_t aVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  adiak_datatype_t *local_b8;
  adiak_datatype_t *local_b0;
  int local_a0;
  int local_9c;
  int *local_98;
  int local_80;
  int local_7c;
  int *local_78;
  int num_elements_1;
  int num_elements;
  int is_longlong;
  int is_long;
  int i;
  int end_brace;
  int cur;
  adiak_datatype_t *t;
  int *new_typestr_start_local;
  va_list *ap_local;
  int local_20;
  int is_reference_local;
  int typestr_end_local;
  int typestr_start_local;
  char *typestr_local;
  
  _end_brace = (adiak_datatype_t *)0x0;
  bVar2 = false;
  bVar11 = false;
  i = typestr_start;
  t = (adiak_datatype_t *)new_typestr_start;
  new_typestr_start_local = (int *)ap;
  ap_local._4_4_ = is_reference;
  local_20 = typestr_end;
  is_reference_local = typestr_start;
  _typestr_end_local = typestr;
  if ((typestr != (char *)0x0) && (typestr_start != typestr_end)) {
    while( true ) {
      ppuVar4 = __ctype_b_loc();
      bVar10 = true;
      if (((*ppuVar4)[(int)_typestr_end_local[i]] & 0x2000) == 0) {
        bVar10 = _typestr_end_local[i] == ',';
      }
      if (!bVar10) break;
      i = i + 1;
    }
    if (_typestr_end_local[i] == '&') {
      ap_local._4_4_ = 1;
      i = i + 1;
    }
    pcVar5 = strchr("[{<(",(int)_typestr_end_local[i]);
    if (pcVar5 != (char *)0x0) {
      _end_brace = (adiak_datatype_t *)malloc(0x20);
      memset(_end_brace,0,0x20);
    }
    if ((_typestr_end_local[i] == '{') || (_typestr_end_local[i] == '[')) {
      endchar = ']';
      if (_typestr_end_local[i] == '{') {
        endchar = '}';
      }
      iVar3 = find_end_brace(_typestr_end_local,endchar,i,local_20);
      if (iVar3 != -1) {
        uVar1 = *new_typestr_start_local;
        if (uVar1 < 0x29) {
          local_78 = (int *)((long)(int)uVar1 + *(long *)(new_typestr_start_local + 4));
          *new_typestr_start_local = uVar1 + 8;
        }
        else {
          local_78 = *(int **)(new_typestr_start_local + 2);
          *(int **)(new_typestr_start_local + 2) = local_78 + 2;
        }
        local_80 = *local_78;
        local_7c = local_80;
        if (ap_local._4_4_ != 0) {
          local_7c = 0;
        }
        _end_brace->num_elements = local_7c;
        if (ap_local._4_4_ == 0) {
          local_80 = 0;
        }
        _end_brace->num_ref_elements = local_80;
        aVar8 = adiak_set;
        if (_typestr_end_local[i] == '{') {
          aVar8 = adiak_list;
        }
        _end_brace->dtype = aVar8;
        _end_brace->numerical = adiak_categorical;
        _end_brace->is_reference = ap_local._4_4_;
        _end_brace->num_subtypes = 1;
        ppaVar6 = (adiak_datatype_t **)malloc(8);
        _end_brace->subtype = ppaVar6;
        paVar7 = parse_typestr_helper
                           (_typestr_end_local,i + 1,iVar3,ap_local._4_4_,
                            (va_list *)new_typestr_start_local,&i);
        *_end_brace->subtype = paVar7;
        if (*_end_brace->subtype != (adiak_datatype_t *)0x0) {
          t->dtype = iVar3 + adiak_long;
          return _end_brace;
        }
      }
    }
    else {
      if (_typestr_end_local[i] != '<') {
        if (_typestr_end_local[i] == '(') {
          iVar3 = find_end_brace(_typestr_end_local,')',i,local_20);
          if (iVar3 == -1) goto LAB_00104ba4;
          _end_brace->dtype = adiak_tuple;
          _end_brace->numerical = adiak_categorical;
          _end_brace->is_reference = ap_local._4_4_;
          uVar1 = *new_typestr_start_local;
          if (uVar1 < 0x29) {
            local_98 = (int *)((long)(int)uVar1 + *(long *)(new_typestr_start_local + 4));
            *new_typestr_start_local = uVar1 + 8;
          }
          else {
            local_98 = *(int **)(new_typestr_start_local + 2);
            *(int **)(new_typestr_start_local + 2) = local_98 + 2;
          }
          iVar9 = *local_98;
          local_9c = iVar9;
          if (ap_local._4_4_ != 0) {
            local_9c = 0;
          }
          _end_brace->num_elements = local_9c;
          local_a0 = iVar9;
          if (ap_local._4_4_ == 0) {
            local_a0 = 0;
          }
          _end_brace->num_ref_elements = local_a0;
          _end_brace->num_subtypes = iVar9;
          ppaVar6 = (adiak_datatype_t **)malloc((long)_end_brace->num_subtypes << 3);
          _end_brace->subtype = ppaVar6;
          memset(_end_brace->subtype,0,(long)_end_brace->num_subtypes << 3);
          i = i + 1;
          for (is_longlong = 0; is_longlong < _end_brace->num_subtypes;
              is_longlong = is_longlong + 1) {
            paVar7 = parse_typestr_helper
                               (_typestr_end_local,i,iVar3,ap_local._4_4_,
                                (va_list *)new_typestr_start_local,&i);
            _end_brace->subtype[is_longlong] = paVar7;
            if (_end_brace->subtype[is_longlong] == (adiak_datatype_t *)0x0) goto LAB_00104ba4;
          }
        }
        else if (_typestr_end_local[i] == '%') {
          iVar3 = i + 1;
          if (_typestr_end_local[i + 1] == 'l') {
            bVar2 = true;
            bVar11 = _typestr_end_local[i + 2] == 'l';
            iVar3 = i + 2;
            if (bVar11) {
              iVar3 = i + 3;
            }
          }
          i = iVar3;
          switch(_typestr_end_local[i]) {
          case 'D':
            _end_brace = &base_date;
            break;
          default:
            goto LAB_00104ba4;
          case 'd':
            if (bVar2) {
              local_b0 = &base_long;
              if (bVar11) {
                local_b0 = &base_longlong;
              }
            }
            else {
              local_b0 = &base_int;
            }
            _end_brace = local_b0;
            break;
          case 'f':
            _end_brace = &base_double;
            break;
          case 'p':
            _end_brace = &base_path;
            if (ap_local._4_4_ != 0) {
              _end_brace = &base_path_ref;
            }
            break;
          case 'r':
            _end_brace = &base_catstring;
            if (ap_local._4_4_ != 0) {
              _end_brace = &base_catstring_ref;
            }
            break;
          case 's':
            _end_brace = &base_string;
            if (ap_local._4_4_ != 0) {
              _end_brace = &base_string_ref;
            }
            break;
          case 't':
            _end_brace = &base_timeval;
            break;
          case 'u':
            if (bVar2) {
              local_b8 = &base_ulong;
              if (bVar11) {
                local_b8 = &base_ulonglong;
              }
            }
            else {
              local_b8 = &base_uint;
            }
            _end_brace = local_b8;
            break;
          case 'v':
            _end_brace = &base_version;
            if (ap_local._4_4_ != 0) {
              _end_brace = &base_version_ref;
            }
          }
          t->dtype = i + adiak_long;
        }
        return _end_brace;
      }
      iVar3 = find_end_brace(_typestr_end_local,'>',i,local_20);
      if (iVar3 != -1) {
        _end_brace->dtype = adiak_range;
        _end_brace->numerical = adiak_categorical;
        _end_brace->is_reference = ap_local._4_4_;
        iVar9 = 2;
        if (ap_local._4_4_ != 0) {
          iVar9 = 0;
        }
        _end_brace->num_elements = iVar9;
        iVar9 = 0;
        if (ap_local._4_4_ != 0) {
          iVar9 = 2;
        }
        _end_brace->num_ref_elements = iVar9;
        _end_brace->num_subtypes = 1;
        ppaVar6 = (adiak_datatype_t **)malloc(8);
        _end_brace->subtype = ppaVar6;
        paVar7 = parse_typestr_helper
                           (_typestr_end_local,i + 1,iVar3,ap_local._4_4_,
                            (va_list *)new_typestr_start_local,&i);
        *_end_brace->subtype = paVar7;
        if (*_end_brace->subtype != (adiak_datatype_t *)0x0) {
          t->dtype = iVar3 + adiak_long;
          return _end_brace;
        }
      }
    }
  }
LAB_00104ba4:
  if (_end_brace != (adiak_datatype_t *)0x0) {
    free_adiak_type(_end_brace);
  }
  return (adiak_datatype_t *)0x0;
}

Assistant:

static adiak_datatype_t *parse_typestr_helper(const char *typestr, int typestr_start, int typestr_end, int is_reference,
                                       va_list *ap, int *new_typestr_start)

{
   adiak_datatype_t *t = NULL;
   int cur = typestr_start;
   int end_brace, i;
   int is_long = 0, is_longlong = 0;

   if (!typestr)
      goto error;
   if (typestr_start == typestr_end)
      goto error;

   while (isspace(typestr[cur]) || typestr[cur] == ',')
      cur++;
   if (typestr[cur] == '&') {
      is_reference = 1;
      cur++;
   }

   if (strchr("[{<(", typestr[cur])) {
      t = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
      memset(t, 0, sizeof(*t));
   }
   if (typestr[cur] == '{' || typestr[cur] == '[') {
      end_brace = find_end_brace(typestr, typestr[cur] == '{' ? '}' : ']',
                                 cur, typestr_end);
      if (end_brace == -1)
         goto error;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->dtype = typestr[cur] == '{' ? adiak_list : adiak_set;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '<') {
      end_brace = find_end_brace(typestr, '>', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_range;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_elements = (is_reference ? 0 : 2);
      t->num_ref_elements = (is_reference ? 2 : 0);
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '(') {
      end_brace = find_end_brace(typestr, ')', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_tuple;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->num_subtypes = num_elements;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * t->num_subtypes);
      memset(t->subtype, 0, sizeof(adiak_datatype_t *) * t->num_subtypes);
      cur++;
      for (i = 0; i < t->num_subtypes; i++) {
         t->subtype[i] = parse_typestr_helper(typestr, cur, end_brace, is_reference, ap, &cur);
         if (!t->subtype[i])
            goto error;
      }
   }
   else if (typestr[cur] == '%') {
      cur++;
      if (typestr[cur] == 'l') {
         is_long = 1;
         cur++;
         if (typestr[cur] == 'l') {
            is_longlong = 1;
            cur++;
         }
      }
      switch (typestr[cur]) {
         case 'd':
            t = is_long ? (is_longlong ? &base_longlong  : &base_long)  : &base_int;
            break;
         case 'u':
            t = is_long ? (is_longlong ? &base_ulonglong : &base_ulong) : &base_uint;
            break;
         case 'f':
            t = &base_double;
            break;
         case 'D':
            t = &base_date;
            break;
         case 't':
            t = &base_timeval;
            break;
         case 'v':
            t = (is_reference ? &base_version_ref : &base_version);
            break;
         case 's':
            t = (is_reference ? &base_string_ref : &base_string);
            break;
         case 'r':
            t = (is_reference ? &base_catstring_ref : &base_catstring);
            break;
         case 'p':
            t = (is_reference ? &base_path_ref : &base_path);
            break;
         default:
            goto error;
      }
      cur++;
      *new_typestr_start = cur;
      goto done;
   }

  done:
   return t;
  error:
   if (t)
      free_adiak_type(t);
   return NULL;
}